

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  char cVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  NameContext *pNVar6;
  Parse *pPVar7;
  SrcList *pSVar8;
  AggInfo *pAVar9;
  ExprList *pEVar10;
  Expr *pEVar11;
  char *zName;
  bool bVar12;
  int iVar13;
  AggInfo_col *pAVar14;
  AggInfo_func *pAVar15;
  FuncDef *pFVar16;
  uint uVar17;
  ulong uVar18;
  SrcList_item *pSVar19;
  int *piVar20;
  char *pcVar21;
  int iVar22;
  ExprList_item *pEVar23;
  int iVar24;
  AggInfo_func *pAVar25;
  uint uVar26;
  int i;
  int i_1;
  int local_44;
  int *local_40;
  int local_34;
  
  pNVar6 = (pWalker->u).pNC;
  pPVar7 = pNVar6->pParse;
  pSVar8 = pNVar6->pSrcList;
  pAVar9 = pNVar6->pAggInfo;
  uVar1 = pExpr->op;
  if (uVar1 == 0x9a) {
LAB_00199491:
    if (pSVar8 == (SrcList *)0x0) {
      return 1;
    }
    if (pSVar8->nSrc < 1) {
      return 1;
    }
    pSVar19 = pSVar8->a;
    local_40 = &pAVar9->nColumn;
    iVar24 = 0;
    do {
      iVar13 = pExpr->iTable;
      iVar4 = pSVar19->iCursor;
      if (iVar13 == iVar4) {
        uVar26 = pAVar9->nColumn;
        bVar12 = 0 < (int)uVar26;
        if (0 < (int)uVar26) {
          piVar20 = &pAVar9->aCol->iColumn;
          uVar18 = 0;
          do {
            if ((piVar20[-1] == iVar13) && (*piVar20 == (int)pExpr->iColumn)) {
              if (bVar12) goto LAB_001995e6;
              break;
            }
            uVar17 = (int)uVar18 + 1;
            uVar18 = (ulong)uVar17;
            bVar12 = (int)uVar17 < (int)uVar26;
            piVar20 = piVar20 + 8;
          } while (uVar26 != uVar17);
        }
        pAVar14 = (AggInfo_col *)
                  sqlite3ArrayAllocate(pPVar7->db,pAVar9->aCol,0x20,local_40,&local_44);
        pAVar9->aCol = pAVar14;
        uVar18 = (ulong)local_44;
        if (-1 < (long)uVar18) {
          pAVar14[uVar18].pTab = pExpr->pTab;
          iVar5 = pExpr->iTable;
          pAVar14[uVar18].iTable = iVar5;
          sVar3 = pExpr->iColumn;
          pAVar14[uVar18].iColumn = (int)sVar3;
          iVar22 = pPVar7->nMem + 1;
          pPVar7->nMem = iVar22;
          pAVar14[uVar18].iMem = iVar22;
          pAVar14[uVar18].iSorterColumn = -1;
          pAVar14[uVar18].pExpr = pExpr;
          pEVar10 = pAVar9->pGroupBy;
          if ((pEVar10 != (ExprList *)0x0) && (0 < pEVar10->nExpr)) {
            pEVar23 = pEVar10->a;
            iVar22 = 0;
            do {
              pEVar11 = pEVar23->pExpr;
              if (((pEVar11->op == 0x98) && (pEVar11->iTable == iVar5)) &&
                 (pEVar11->iColumn == sVar3)) {
                pAVar14[uVar18].iSorterColumn = iVar22;
                break;
              }
              iVar22 = iVar22 + 1;
              pEVar23 = pEVar23 + 1;
            } while (pEVar10->nExpr != iVar22);
          }
          if (pAVar14[uVar18].iSorterColumn < 0) {
            iVar5 = pAVar9->nSortingColumn;
            pAVar9->nSortingColumn = iVar5 + 1;
            pAVar14[uVar18].iSorterColumn = iVar5;
          }
        }
LAB_001995e6:
        pExpr->pAggInfo = pAVar9;
        pExpr->op = 0x9a;
        pExpr->iAgg = (i16)uVar18;
        if (iVar13 == iVar4) {
          return 1;
        }
      }
      iVar24 = iVar24 + 1;
      pSVar19 = pSVar19 + 1;
      if (pSVar8->nSrc <= iVar24) {
        return 1;
      }
    } while( true );
  }
  if (uVar1 != 0x99) {
    if (uVar1 != 0x98) {
      return 0;
    }
    goto LAB_00199491;
  }
  if ((pNVar6->ncFlags & 8) != 0) {
    return 0;
  }
  if (pWalker->walkerDepth != (uint)pExpr->op2) {
    return 0;
  }
  pAVar15 = pAVar9->aFunc;
  iVar24 = pAVar9->nFunc;
  bVar12 = 0 < iVar24;
  if (0 < iVar24) {
    iVar13 = sqlite3ExprCompare(pAVar15->pExpr,pExpr);
    if (iVar13 == 0) {
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      pAVar25 = pAVar15;
      do {
        pAVar25 = pAVar25 + 1;
        if (iVar24 + -1 == (int)uVar18) goto LAB_0019968b;
        iVar13 = sqlite3ExprCompare(pAVar25->pExpr,pExpr);
        uVar26 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar26;
      } while (iVar13 != 0);
      bVar12 = (int)uVar26 < iVar24;
    }
    if (bVar12) goto LAB_0019974f;
  }
LAB_0019968b:
  uVar1 = pPVar7->db->aDb->pSchema->enc;
  pAVar15 = (AggInfo_func *)sqlite3ArrayAllocate(pPVar7->db,pAVar15,0x18,&pAVar9->nFunc,&local_34);
  pAVar9->aFunc = pAVar15;
  uVar18 = (ulong)local_34;
  if (-1 < (long)uVar18) {
    pAVar15[uVar18].pExpr = pExpr;
    iVar24 = pPVar7->nMem + 1;
    pPVar7->nMem = iVar24;
    pAVar15[uVar18].iMem = iVar24;
    zName = (pExpr->u).zToken;
    iVar24 = 0;
    uVar26 = 0;
    if (zName != (char *)0x0) {
      uVar26 = 0xffffffff;
      pcVar21 = zName;
      do {
        uVar26 = uVar26 + 1;
        cVar2 = *pcVar21;
        pcVar21 = pcVar21 + 1;
      } while (cVar2 != '\0');
      uVar26 = uVar26 & 0x3fffffff;
    }
    if ((pExpr->x).pList != (ExprList *)0x0) {
      iVar24 = ((pExpr->x).pList)->nExpr;
    }
    pFVar16 = sqlite3FindFunction(pPVar7->db,zName,uVar26,iVar24,uVar1,'\0');
    pAVar15[uVar18].pFunc = pFVar16;
    iVar24 = -1;
    if ((pExpr->flags & 0x10) != 0) {
      iVar24 = pPVar7->nTab;
      pPVar7->nTab = iVar24 + 1;
    }
    pAVar15[uVar18].iDistinct = iVar24;
  }
LAB_0019974f:
  pExpr->iAgg = (i16)uVar18;
  pExpr->pAggInfo = pAVar9;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->pAggInfo;

  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetIrreducible(pExpr);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(pItem->pExpr, pExpr)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, sqlite3Strlen30(pExpr->u.zToken),
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetIrreducible(pExpr);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}